

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

bool CheckWildCard(char *szString,char *szWildCard)

{
  bool bVar1;
  char *szWildCard_00;
  char *szWildCardPtr;
  char *szWildCard_local;
  char *szString_local;
  
  szWildCardPtr = szWildCard;
  szWildCard_local = szString;
LAB_0010e852:
  for (; *szWildCardPtr == '?'; szWildCardPtr = szWildCardPtr + 1) {
    if (*szWildCard_local == '\0') {
      return false;
    }
    szWildCard_local = szWildCard_local + 1;
  }
  if (*szWildCardPtr == '\0') {
    return *szWildCard_local == '\0';
  }
  if (*szWildCardPtr == '*') goto code_r0x0010e8b1;
  if (AsciiToUpperTable_BkSlash[*szWildCardPtr] != AsciiToUpperTable_BkSlash[*szWildCard_local]) {
    return false;
  }
  szWildCardPtr = szWildCardPtr + 1;
  goto LAB_0010e963;
code_r0x0010e8b1:
  szWildCard_00 = szWildCardPtr + 1;
  if (*szWildCard_00 != '*') {
    if (*szWildCard_00 == '\0') {
      return true;
    }
    if ((AsciiToUpperTable_BkSlash[*szWildCard_00] == AsciiToUpperTable_BkSlash[*szWildCard_local])
       && (bVar1 = CheckWildCard(szWildCard_local,szWildCard_00), bVar1)) {
      return true;
    }
LAB_0010e963:
    if (*szWildCard_local == '\0') {
      return false;
    }
    szWildCard_local = szWildCard_local + 1;
  }
  goto LAB_0010e852;
}

Assistant:

bool CheckWildCard(const char * szString, const char * szWildCard)
{
    const char * szWildCardPtr;

    for(;;)
    {
        // If there is '?' in the wildcard, we skip one char
        while(szWildCard[0] == '?')
        {
            if(szString[0] == 0)
                return false;

            szWildCard++;
            szString++;
        }

        // Handle '*'
        szWildCardPtr = szWildCard;
        if(szWildCardPtr[0] != 0)
        {
            if(szWildCardPtr[0] == '*')
            {
                szWildCardPtr++;

                if(szWildCardPtr[0] == '*')
                    continue;

                if(szWildCardPtr[0] == 0)
                    return true;

                if(AsciiToUpperTable_BkSlash[szWildCardPtr[0]] == AsciiToUpperTable_BkSlash[szString[0]])
                {
                    if(CheckWildCard(szString, szWildCardPtr))
                        return true;
                }
            }
            else
            {
                if(AsciiToUpperTable_BkSlash[szWildCardPtr[0]] != AsciiToUpperTable_BkSlash[szString[0]])
                    return false;

                szWildCard = szWildCardPtr + 1;
            }

            if(szString[0] == 0)
                return false;
            szString++;
        }
        else
        {
            return (szString[0] == 0) ? true : false;
        }
    }
}